

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneParser.cpp
# Opt level: O2

void __thiscall SceneParser::~SceneParser(SceneParser *this)

{
  pointer ppMVar1;
  pointer ppOVar2;
  CubeMap *this_00;
  pointer ppOVar3;
  pointer ppMVar4;
  
  if (this->_group != (Group *)0x0) {
    (*(this->_group->super_Object3D)._vptr_Object3D[1])();
  }
  if (this->_camera != (Camera *)0x0) {
    (*this->_camera->_vptr_Camera[1])();
  }
  ppMVar1 = (this->_materials).super__Vector_base<Material_*,_std::allocator<Material_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppMVar4 = (this->_materials).super__Vector_base<Material_*,_std::allocator<Material_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppMVar4 != ppMVar1; ppMVar4 = ppMVar4 + 1
      ) {
    operator_delete(*ppMVar4);
  }
  ppOVar2 = (this->_objects).super__Vector_base<Object3D_*,_std::allocator<Object3D_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppOVar3 = (this->_objects).super__Vector_base<Object3D_*,_std::allocator<Object3D_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppOVar3 != ppOVar2; ppOVar3 = ppOVar3 + 1
      ) {
    if (*ppOVar3 != (Object3D *)0x0) {
      (*(*ppOVar3)->_vptr_Object3D[1])();
    }
  }
  this_00 = this->_cubemap;
  if (this_00 != (CubeMap *)0x0) {
    CubeMap::~CubeMap(this_00);
  }
  operator_delete(this_00);
  std::_Vector_base<Object3D_*,_std::allocator<Object3D_*>_>::~_Vector_base
            (&(this->_objects).super__Vector_base<Object3D_*,_std::allocator<Object3D_*>_>);
  std::_Vector_base<Material_*,_std::allocator<Material_*>_>::~_Vector_base
            (&(this->_materials).super__Vector_base<Material_*,_std::allocator<Material_*>_>);
  std::__cxx11::string::~string((string *)&this->_basepath);
  std::_Vector_base<Object3D_*,_std::allocator<Object3D_*>_>::~_Vector_base
            ((_Vector_base<Object3D_*,_std::allocator<Object3D_*>_> *)this);
  return;
}

Assistant:

SceneParser::~SceneParser() {
    delete _group;
    delete _camera;
    for (auto *material : _materials) {
        delete material;
    }
    for (auto *object : _objects) {
        delete object;
    }
    delete _cubemap;
}